

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naviebayes.cpp
# Opt level: O2

void __thiscall NavieBayes::bayesEstim(NavieBayes *this,double *lmbda)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *this_00;
  double dVar1;
  double dVar2;
  double *pdVar3;
  pointer pvVar4;
  pointer pdVar5;
  mapped_type_conflict *pmVar6;
  _Rb_tree_node_base *p_Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  double *gt;
  double *pdVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  string local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  cond;
  string local_50;
  
  pdVar3 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->priProb;
  for (pdVar13 = (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start; pdVar13 != pdVar3; pdVar13 = pdVar13 + 1)
  {
    std::__cxx11::to_string(&cond.first,*pdVar13);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
             ::operator[](this_00,&cond.first);
    *pmVar6 = *pmVar6 + 1.0;
    std::__cxx11::string::~string((string *)&cond);
  }
  for (uVar10 = 0; uVar11 = (this->super_Base).indim, uVar10 < uVar11; uVar10 = uVar10 + 1) {
    lVar12 = 0;
    uVar11 = 0;
    while( true ) {
      pvVar4 = (this->super_Base).trainDataF.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->super_Base).trainDataF.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4) / 0x18) <=
          uVar11) break;
      std::__cxx11::to_string
                (&local_b0,
                 *(double *)
                  (*(long *)((long)&(pvVar4->super__Vector_base<double,_std::allocator<double>_>).
                                    _M_impl.super__Vector_impl_data + lVar12) + uVar10 * 8));
      std::__cxx11::to_string
                (&local_50,
                 (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11]);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (&cond,&local_b0,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::to_string
                (&local_b0,
                 (this->super_Base).trainDataGT.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar11]);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](this_00,&local_b0);
      dVar1 = *pmVar6;
      dVar2 = *lmbda;
      pvVar4 = (this->xVal).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = *(long *)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      pdVar5 = *(pointer *)
                ((long)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data + 8);
      pmVar6 = std::
               map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
               ::operator[]((map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_double>_>_>
                             *)(*(long *)&this->condProb + uVar10 * 0x30),&cond);
      lVar8 = (long)pdVar5 - lVar8;
      lVar9 = lVar8 >> 3;
      auVar14._8_4_ = (int)(lVar8 >> 0x23);
      auVar14._0_8_ = lVar9;
      auVar14._12_4_ = 0x45300000;
      *pmVar6 = 1.0 / (dVar2 * ((auVar14._8_8_ - 1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) +
                      dVar1) + *pmVar6;
      std::__cxx11::string::~string((string *)&local_b0);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&cond);
      uVar11 = uVar11 + 1;
      lVar12 = lVar12 + 0x18;
    }
  }
  for (uVar10 = 0; uVar10 < uVar11; uVar10 = uVar10 + 1) {
    lVar12 = *(long *)&this->condProb + uVar10 * 0x30;
    for (p_Var7 = *(_Rb_tree_node_base **)(lVar12 + 0x18);
        p_Var7 != (_Rb_tree_node_base *)(lVar12 + 8);
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      dVar1 = *lmbda;
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
               ::operator[](this_00,(key_type *)(p_Var7 + 2));
      pvVar4 = (this->xVal).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)*(pointer *)
                     ((long)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar4[uVar10].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data;
      lVar9 = lVar8 >> 3;
      auVar15._8_4_ = (int)(lVar8 >> 0x23);
      auVar15._0_8_ = lVar9;
      auVar15._12_4_ = 0x45300000;
      *(double *)(p_Var7 + 3) =
           dVar1 / (((auVar15._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0)) * *lmbda +
                   *pmVar6) + *(double *)(p_Var7 + 3);
    }
    uVar11 = (this->super_Base).indim;
  }
  lVar12 = ((long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(this->yVal).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3) +
           ((long)(this->super_Base).trainDataF.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->super_Base).trainDataF.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  auVar16._8_4_ = (int)((ulong)lVar12 >> 0x20);
  auVar16._0_8_ = lVar12;
  auVar16._12_4_ = 0x45300000;
  for (p_Var7 = *(_Rb_tree_node_base **)&this->field_0x118;
      p_Var7 != (_Rb_tree_node_base *)&this->field_0x108;
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
    *(double *)(p_Var7 + 2) =
         (*(double *)(p_Var7 + 2) + *lmbda) /
         ((auVar16._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)lVar12) - 4503599627370496.0));
  }
  return;
}

Assistant:

void NavieBayes::bayesEstim(const double& lmbda = 1.0){
    for(const auto& gt: trainDataGT){
        priProb[std::to_string(gt)] += 1.0;
    }
    for(unsigned long i=0;i<indim;++i){
        for(unsigned long j=0;j<trainDataF.size();++j)
        {
            auto cond = std::make_pair(std::to_string(trainDataF[j][i]), std::to_string(trainDataGT[j]));

            condProb[i][cond] += 1.0/(priProb[std::to_string(trainDataGT[j])]+lmbda*xVal[i].size());
        }
    }
    for(unsigned long i=0;i<indim;++i){
        for(auto& d:condProb[i]){
            d.second += lmbda/(priProb[d.first.second]+lmbda*xVal[i].size());
        }
    }

    for(auto& iter:priProb)
        iter.second = (iter.second+lmbda)/(double(trainDataF.size()+yVal.size()));
}